

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index.h
# Opt level: O2

bool S2ShapeIndex::IteratorBase::LocateImpl<S2ShapeIndex::Iterator>
               (S2Point *target_point,Iterator *it)

{
  _Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false> _Var1;
  S2CellId SVar2;
  char cVar3;
  bool bVar4;
  ulong in_RAX;
  S2CellId target;
  S2CellId local_18;
  
  local_18.id_ = in_RAX;
  S2CellId::S2CellId(&local_18,target_point);
  _Var1._M_head_impl =
       (it->iter_)._M_t.
       super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
       ._M_t.
       super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
       .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl;
  (**(code **)((long)(_Var1._M_head_impl)->_vptr_IteratorBase + 0x30))
            (_Var1._M_head_impl,local_18.id_);
  _Var1._M_head_impl =
       (it->iter_)._M_t.
       super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
       ._M_t.
       super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
       .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl;
  SVar2.id_ = ((_Var1._M_head_impl)->id_).id_;
  if ((SVar2.id_ != 0xffffffffffffffff) &&
     (SVar2.id_ - (~SVar2.id_ & SVar2.id_ - 1) <= local_18.id_)) {
    return true;
  }
  cVar3 = (**(code **)((long)(_Var1._M_head_impl)->_vptr_IteratorBase + 0x28))();
  if ((cVar3 == '\0') ||
     (SVar2.id_ = (((it->iter_)._M_t.
                    super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                    .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl)->id_).
                  id_, bVar4 = true, (SVar2.id_ - 1 | SVar2.id_) < local_18.id_)) {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

inline bool S2ShapeIndex::IteratorBase::LocateImpl(
    const S2Point& target_point, Iter* it) {
  // Let I = cell_map_->lower_bound(T), where T is the leaf cell containing
  // "target_point".  Then if T is contained by an index cell, then the
  // containing cell is either I or I'.  We test for containment by comparing
  // the ranges of leaf cells spanned by T, I, and I'.

  S2CellId target(target_point);
  it->Seek(target);
  if (!it->done() && it->id().range_min() <= target) return true;
  if (it->Prev() && it->id().range_max() >= target) return true;
  return false;
}